

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsLineItem::QGraphicsLineItem(QGraphicsLineItem *this,QGraphicsItem *parent)

{
  QGraphicsLineItemPrivate *this_00;
  QGraphicsItem *in_RSI;
  QGraphicsItemPrivate *in_RDI;
  
  this_00 = (QGraphicsLineItemPrivate *)operator_new(0x1a0);
  QGraphicsLineItemPrivate::QGraphicsLineItemPrivate(this_00);
  QGraphicsItem::QGraphicsItem(in_RSI,in_RDI,(QGraphicsItem *)this_00);
  in_RDI->_vptr_QGraphicsItemPrivate = (_func_int **)&PTR__QGraphicsLineItem_00d32c48;
  return;
}

Assistant:

QGraphicsLineItem::QGraphicsLineItem(QGraphicsItem *parent)
    : QGraphicsItem(*new QGraphicsLineItemPrivate, parent)
{
}